

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp1.c
# Opt level: O0

void ssh1_bpp_handle_input(BinaryPacketProtocol *bpp)

{
  long lVar1;
  _func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *p_Var2;
  PacketLogSettings *pls;
  LogContext *ctx;
  _Bool _Var3;
  int iVar4;
  uint32_t uVar5;
  int n_blanks;
  Ssh *pSVar6;
  Ssh *pSVar7;
  char *texttype;
  ptrlen pVar8;
  int type;
  undefined1 local_98 [4];
  int nblanks;
  logblank_t blanks [4];
  PktIn *old_pktin;
  uchar *puStack_40;
  int decomplen;
  uchar *decompblk;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24 [4];
  _Bool success_1;
  _Bool success;
  PktOutQueue *pPStack_20;
  uchar lenbuf [4];
  int *crLine;
  ssh1_bpp_state *s;
  BinaryPacketProtocol *bpp_local;
  
  pPStack_20 = &bpp[-1].out_pq;
  iVar4 = *(int *)&(pPStack_20->pqb).end.next;
  if (iVar4 == 0) goto LAB_00121dee;
  if (iVar4 == 0x8f) goto LAB_00121e12;
  if (iVar4 != 0xa9) {
    *(undefined4 *)&(pPStack_20->pqb).end.next = 0;
    return;
  }
  while( true ) {
    local_26 = bufchain_try_fetch_consume
                         (bpp->in_raw,bpp[-1].out_pq.after,
                          *(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue);
    if ((!(bool)local_26) && ((bpp->input_eof & 1U) == 0)) {
      return;
    }
    if (!(bool)local_26) break;
    ssh_check_frozen(bpp->ssh);
    if ((bpp[-1].ic_in_raw.fn != (toplevel_callback_fn_t)0x0) &&
       (_Var3 = detect_attack(*(crcda_ctx **)&bpp[-1].ic_in_raw.queued,(uchar *)bpp[-1].out_pq.after
                              ,(uint32_t)*(undefined8 *)&bpp[-1].out_pq.pqb.end.on_free_queue,
                              (uchar *)&bpp[-1].ic_out_pq), _Var3)) {
      ssh_sw_abort(bpp->ssh,"Network attack (CRC compensation) detected!");
      *(undefined4 *)&(pPStack_20->pqb).end.next = 0;
      return;
    }
    if (*(long *)&bpp[-1].out_pq.pqb.end.on_free_queue < 8) {
      __assert_fail("s->biglen >= 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/bpp1.c",
                    0xb3,"void ssh1_bpp_handle_input(BinaryPacketProtocol *)");
    }
    bpp[-1].ic_out_pq.fn =
         *(toplevel_callback_fn_t *)
          (bpp[-1].out_pq.after + *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue + -8);
    if (bpp[-1].ic_in_raw.fn != (toplevel_callback_fn_t)0x0) {
      ssh_cipher_decrypt((ssh_cipher *)bpp[-1].ic_in_raw.fn,bpp[-1].out_pq.after,
                         (int)*(undefined8 *)&bpp[-1].out_pq.pqb.end.on_free_queue);
    }
    _decompblk = make_ptrlen(bpp[-1].out_pq.after,*(long *)&bpp[-1].out_pq.pqb.end.on_free_queue - 4
                            );
    uVar5 = crc32_ssh1(_decompblk);
    *(uint32_t *)&bpp[-1].pls = uVar5;
    uVar5 = GET_32BIT_MSB_FIRST(bpp[-1].out_pq.after +
                                *(long *)&bpp[-1].out_pq.pqb.end.on_free_queue + -4);
    *(uint32_t *)((long)&bpp[-1].pls + 4) = uVar5;
    if (*(int *)((long)&bpp[-1].pls + 4) != *(int *)&bpp[-1].pls) {
      ssh_sw_abort(bpp->ssh,"Incorrect CRC received on packet");
      *(undefined4 *)&(pPStack_20->pqb).end.next = 0;
      return;
    }
    lVar1._0_4_ = bpp[-1].remote_bugs;
    lVar1._4_1_ = bpp[-1].ext_info_rsa_sha256_ok;
    lVar1._5_1_ = bpp[-1].ext_info_rsa_sha512_ok;
    lVar1._6_1_ = bpp[-1].expect_close;
    lVar1._7_1_ = bpp[-1].field_0xdf;
    if (lVar1 != 0) {
      _Var3 = ssh_decompressor_decompress
                        (*(ssh_decompressor **)&bpp[-1].remote_bugs,
                         (uchar *)(bpp[-1].out_pq.after + bpp[-1].out_pq.pqb.end.formal_size),
                         (int)bpp[-1].out_pq.pqb.total_size + 1,&stack0xffffffffffffffc0,
                         (int *)((long)&old_pktin + 4));
      if (!_Var3) {
        ssh_sw_abort(bpp->ssh,"Zlib decompression encountered invalid data");
        *(undefined4 *)&(pPStack_20->pqb).end.next = 0;
        return;
      }
      if ((long)bpp[-1].out_pq.pqb.ic <
          (long)(bpp[-1].out_pq.pqb.end.formal_size + (long)old_pktin._4_4_)) {
        pSVar6 = bpp[-1].ssh;
        bpp[-1].out_pq.pqb.ic =
             (IdempotentCallback *)(bpp[-1].out_pq.pqb.end.formal_size + (long)old_pktin._4_4_);
        pSVar7 = (Ssh *)safemalloc(1,0x58,(size_t)bpp[-1].out_pq.pqb.ic);
        bpp[-1].ssh = pSVar7;
        memcpy(bpp[-1].ssh,pSVar6,0x58);
        bpp[-1].out_pq.after =
             (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)(bpp[-1].ssh + 0x16);
        smemclr(pSVar6,*(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue);
        safefree(pSVar6);
      }
      memcpy(bpp[-1].out_pq.after + bpp[-1].out_pq.pqb.end.formal_size,puStack_40,
             (long)old_pktin._4_4_);
      safefree(puStack_40);
      bpp[-1].out_pq.pqb.total_size = (long)(old_pktin._4_4_ + -1);
    }
    bpp[-1].out_pq.after = bpp[-1].out_pq.after + bpp[-1].out_pq.pqb.end.formal_size;
    p_Var2 = bpp[-1].out_pq.after;
    bpp[-1].out_pq.after = p_Var2 + 1;
    (bpp[-1].ssh)->dummy = (uint)(byte)*p_Var2;
    pSVar6 = bpp[-1].ssh;
    pVar8 = make_ptrlen(bpp[-1].out_pq.after,bpp[-1].out_pq.pqb.total_size);
    BinarySource_INIT__((BinarySource *)(pSVar6 + 0xc),pVar8);
    if (bpp->logctx != (LogContext *)0x0) {
      pls = bpp->pls;
      iVar4 = (bpp[-1].ssh)->dummy;
      pVar8 = make_ptrlen(bpp[-1].out_pq.after,bpp[-1].out_pq.pqb.total_size);
      n_blanks = ssh1_censor_packet(pls,iVar4,false,pVar8,(logblank_t *)local_98);
      ctx = bpp->logctx;
      iVar4 = (bpp[-1].ssh)->dummy;
      texttype = ssh1_pkt_type((bpp[-1].ssh)->dummy);
      log_packet(ctx,0,iVar4,texttype,
                 (void *)(*(long *)(bpp[-1].ssh + 0xc) + *(long *)(bpp[-1].ssh + 0xe)),
                 *(long *)(bpp[-1].ssh + 0x10) - *(long *)(bpp[-1].ssh + 0xe),n_blanks,
                 (logblank_t *)local_98,(unsigned_long *)0x0,0,(char *)0x0);
    }
    pSVar6 = bpp[-1].ssh;
    *(long *)(pSVar6 + 8) = *(long *)(pSVar6 + 0x10) - *(long *)(pSVar6 + 0xe);
    pq_base_push(&(bpp->in_pq).pqb,(PacketQueueNode *)(bpp[-1].ssh + 4));
    iVar4 = (bpp[-1].ssh)->dummy;
    bpp[-1].ssh = (Ssh *)0x0;
    if ((iVar4 == 0xe || iVar4 == 0xf) && (((ulong)bpp[-1].ic_out_pq.ctx & 1) != 0)) {
      if (iVar4 == 0xe) {
        ssh1_bpp_start_compression(bpp);
      }
      *(undefined1 *)&bpp[-1].ic_out_pq.ctx = 0;
      queue_idempotent_callback(&bpp->ic_out_pq);
    }
LAB_00121dee:
    bpp[-1].out_pq.pqb.ic = (IdempotentCallback *)0x0;
    bpp[-1].out_pq.pqb.total_size = 0;
    *(undefined4 *)&(pPStack_20->pqb).end.next = 0x8f;
LAB_00121e12:
    local_25 = bufchain_try_fetch_consume(bpp->in_raw,local_24,4);
    if ((!(bool)local_25) && ((bpp->input_eof & 1U) == 0)) {
      return;
    }
    if (!(bool)local_25) break;
    ssh_check_frozen(bpp->ssh);
    uVar5 = GET_32BIT_MSB_FIRST(local_24);
    iVar4 = toint(uVar5);
    bpp[-1].out_pq.pqb.end.prev = (PacketQueueNode *)(long)iVar4;
    if (((long)bpp[-1].out_pq.pqb.end.prev < 5) || (0x40000 < (long)bpp[-1].out_pq.pqb.end.prev)) {
      ssh_sw_abort(bpp->ssh,"Out-of-range packet length from remote suggests data stream corruption"
                  );
      *(undefined4 *)&(pPStack_20->pqb).end.next = 0;
      return;
    }
    bpp[-1].out_pq.pqb.end.formal_size = 8 - (long)bpp[-1].out_pq.pqb.end.prev % 8;
    *(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue =
         (long)&(bpp[-1].out_pq.pqb.end.prev)->next + bpp[-1].out_pq.pqb.end.formal_size;
    bpp[-1].out_pq.pqb.total_size = (size_t)&bpp[-1].out_pq.pqb.end.prev[-1].field_0x1b;
    pSVar6 = (Ssh *)safemalloc(1,0x58,*(size_t *)&bpp[-1].out_pq.pqb.end.on_free_queue);
    bpp[-1].ssh = pSVar6;
    *(undefined8 *)(bpp[-1].ssh + 4) = 0;
    *(undefined8 *)(bpp[-1].ssh + 6) = 0;
    *(undefined1 *)&bpp[-1].ssh[10].dummy = 0;
    (bpp[-1].ssh)->dummy = 0;
    bpp[-1].out_pq.pqb.ic = *(IdempotentCallback **)&bpp[-1].out_pq.pqb.end.on_free_queue;
    bpp[-1].out_pq.after =
         (_func_PktOut_ptr_PacketQueueBase_ptr_PacketQueueNode_ptr__Bool *)(bpp[-1].ssh + 0x16);
    *(undefined4 *)&(pPStack_20->pqb).end.next = 0xa9;
  }
  if ((bpp->expect_close & 1U) == 0) {
    ssh_remote_error(bpp->ssh,"Remote side unexpectedly closed network connection");
    return;
  }
  ssh_remote_eof(bpp->ssh,"Remote side closed network connection");
  return;
}

Assistant:

static void ssh1_bpp_handle_input(BinaryPacketProtocol *bpp)
{
    struct ssh1_bpp_state *s = container_of(bpp, struct ssh1_bpp_state, bpp);

    crBegin(s->crState);

    while (1) {
        s->maxlen = 0;
        s->length = 0;

        {
            unsigned char lenbuf[4];
            BPP_READ(lenbuf, 4);
            s->len = toint(GET_32BIT_MSB_FIRST(lenbuf));
        }

        if (s->len < 5 || s->len > 262144) { /* SSH1.5-mandated max size */
            ssh_sw_abort(s->bpp.ssh,
                         "Out-of-range packet length from remote suggests"
                         " data stream corruption");
            crStopV;
        }

        s->pad = 8 - (s->len % 8);
        s->biglen = s->len + s->pad;
        s->length = s->len - 5;

        /*
         * Allocate the packet to return, now we know its length.
         */
        s->pktin = snew_plus(PktIn, s->biglen);
        s->pktin->qnode.prev = s->pktin->qnode.next = NULL;
        s->pktin->qnode.on_free_queue = false;
        s->pktin->type = 0;

        s->maxlen = s->biglen;
        s->data = snew_plus_get_aux(s->pktin);

        BPP_READ(s->data, s->biglen);

        if (s->cipher_in && detect_attack(s->crcda_ctx,
                                          s->data, s->biglen, s->iv)) {
            ssh_sw_abort(s->bpp.ssh,
                         "Network attack (CRC compensation) detected!");
            crStopV;
        }
        /* Save the last cipher block, to be passed to the next call
         * to detect_attack */
        assert(s->biglen >= 8);
        memcpy(s->iv, s->data + s->biglen - 8, sizeof(s->iv));

        if (s->cipher_in)
            ssh_cipher_decrypt(s->cipher_in, s->data, s->biglen);

        s->realcrc = crc32_ssh1(make_ptrlen(s->data, s->biglen - 4));
        s->gotcrc = GET_32BIT_MSB_FIRST(s->data + s->biglen - 4);
        if (s->gotcrc != s->realcrc) {
            ssh_sw_abort(s->bpp.ssh, "Incorrect CRC received on packet");
            crStopV;
        }

        if (s->decompctx) {
            unsigned char *decompblk;
            int decomplen;
            if (!ssh_decompressor_decompress(
                    s->decompctx, s->data + s->pad, s->length + 1,
                    &decompblk, &decomplen)) {
                ssh_sw_abort(s->bpp.ssh,
                             "Zlib decompression encountered invalid data");
                crStopV;
            }

            if (s->maxlen < s->pad + decomplen) {
                PktIn *old_pktin = s->pktin;

                s->maxlen = s->pad + decomplen;
                s->pktin = snew_plus(PktIn, s->maxlen);
                *s->pktin = *old_pktin; /* structure copy */
                s->data = snew_plus_get_aux(s->pktin);

                smemclr(old_pktin, s->biglen);
                sfree(old_pktin);
            }

            memcpy(s->data + s->pad, decompblk, decomplen);
            sfree(decompblk);
            s->length = decomplen - 1;
        }

        /*
         * Now we can find the bounds of the semantic content of the
         * packet, and the initial type byte.
         */
        s->data += s->pad;
        s->pktin->type = *s->data++;
        BinarySource_INIT(s->pktin, s->data, s->length);

        if (s->bpp.logctx) {
            logblank_t blanks[MAX_BLANKS];
            int nblanks = ssh1_censor_packet(
                s->bpp.pls, s->pktin->type, false,
                make_ptrlen(s->data, s->length), blanks);
            log_packet(s->bpp.logctx, PKT_INCOMING, s->pktin->type,
                       ssh1_pkt_type(s->pktin->type),
                       get_ptr(s->pktin), get_avail(s->pktin), nblanks, blanks,
                       NULL, 0, NULL);
        }

        s->pktin->qnode.formal_size = get_avail(s->pktin);
        pq_push(&s->bpp.in_pq, s->pktin);

        {
            int type = s->pktin->type;
            s->pktin = NULL;

            switch (type) {
              case SSH1_SMSG_SUCCESS:
              case SSH1_SMSG_FAILURE:
                if (s->pending_compression_request) {
                    /*
                     * This is the response to
                     * SSH1_CMSG_REQUEST_COMPRESSION.
                     */
                    if (type == SSH1_SMSG_SUCCESS) {
                        /*
                         * If the response was positive, start
                         * compression.
                         */
                        ssh1_bpp_start_compression(&s->bpp);
                    }

                    /*
                     * Either way, cancel the pending flag, and
                     * schedule a run of our output side in case we
                     * had any packets queued up in the meantime.
                     */
                    s->pending_compression_request = false;
                    queue_idempotent_callback(&s->bpp.ic_out_pq);
                }
                break;
            }
        }
    }

  eof:
    if (!s->bpp.expect_close) {
        ssh_remote_error(s->bpp.ssh,
                         "Remote side unexpectedly closed network connection");
    } else {
        ssh_remote_eof(s->bpp.ssh, "Remote side closed network connection");
    }
    return;  /* avoid touching s now it's been freed */

    crFinishV;
}